

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

Value ** __thiscall
ValueHashTable<ExprHash,_Value_*>::FindOrInsertNew
          (ValueHashTable<ExprHash,_Value_*> *this,ExprHash value)

{
  bool bVar1;
  uint key_00;
  uint uVar2;
  Type *pTVar3;
  HashBucket *newBucket;
  HashBucket *bucket;
  EditingIterator iter;
  uint depth;
  uint hash;
  uint key;
  ValueHashTable<ExprHash,_Value_*> *this_local;
  ExprHash value_local;
  
  key_00 = ::Key::Get(value);
  iter.last._4_4_ = Hash(this,key_00);
  iter.last._0_4_ = 1;
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&bucket,this->table + iter.last._4_4_);
  do {
    bVar1 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)&bucket);
    if (!bVar1) {
LAB_005fec4c:
      pTVar3 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
               EditingIterator::InsertNodeBefore
                         ((EditingIterator *)&bucket,&this->alloc->super_ArenaAllocator);
      pTVar3->value = value;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Insert(this->stats,(uint)iter.last);
      }
      return &pTVar3->element;
    }
    pTVar3 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)&bucket);
    uVar2 = ::Key::Get(pTVar3->value);
    if (uVar2 <= key_00) {
      uVar2 = ::Key::Get(pTVar3->value);
      if (uVar2 == key_00) {
        return &pTVar3->element;
      }
      goto LAB_005fec4c;
    }
    iter.last._0_4_ = (uint)iter.last + 1;
  } while( true );
}

Assistant:

TElement * FindOrInsertNew(TData value)
    {
        uint key = Key::Get(value);
        uint hash = this->Hash(key);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, &this->table[hash], iter)
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        HashBucket * newBucket = iter.InsertNodeBefore(this->alloc);
        newBucket->value = value;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return &newBucket->element;
    }